

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void __thiscall ImGuiTableColumnSettings::ImGuiTableColumnSettings(ImGuiTableColumnSettings *this)

{
  this->WidthOrWeight = 0.0;
  this->UserID = 0;
  this->Index = -1;
  this->DisplayOrder = -1;
  this->SortOrder = -1;
  this->field_0xb = this->field_0xb & 0xf0 | 4;
  return;
}

Assistant:

ImGuiTableColumnSettings()
    {
        WidthOrWeight = 0.0f;
        UserID = 0;
        Index = -1;
        DisplayOrder = SortOrder = -1;
        SortDirection = ImGuiSortDirection_None;
        IsVisible = 1;
        IsStretch = 0;
    }